

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O1

void __thiscall
Centaurus::LookaheadDFA<wchar_t>::print
          (LookaheadDFA<wchar_t> *this,wostream *os,wstring *graph_name)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  wostream *pwVar4;
  ulong uVar5;
  pointer pLVar6;
  int iVar7;
  wchar_t wVar8;
  ulong uVar9;
  
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"digraph ",8);
  pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (os,(graph_name->_M_dataplus)._M_p,graph_name->_M_string_length);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,L" {",2);
  plVar1 = *(long **)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0xf0);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x50))(plVar1,10);
    std::wostream::put((wchar_t)pwVar4);
    std::wostream::flush();
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"rankdir=\"LR\";",0xd);
    plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x50))(plVar1,10);
      wVar8 = (wchar_t)os;
      std::wostream::put(wVar8);
      std::wostream::flush();
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (os,L"graph [ charset=\"UTF-8\", style=\"filled\" ];",0x2a);
      plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x50))(plVar1,10);
        std::wostream::put(wVar8);
        std::wostream::flush();
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                  (os,L"node [ style=\"solid,filled\" ];",0x1e);
        plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 0x50))(plVar1,10);
          std::wostream::put(wVar8);
          std::wostream::flush();
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                    (os,L"edge [ style=\"solid\" ];",0x17);
          plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 0x50))(plVar1,10);
            std::wostream::put(wVar8);
            std::wostream::flush();
            iVar2 = get_color_num(this);
            if (0 < iVar2) {
              iVar7 = 1;
              do {
                std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"A",1);
                pwVar4 = (wostream *)std::wostream::operator<<((wostream *)os,iVar7);
                std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,L" [ label=\"",10);
                std::wostream::operator<<((wostream *)os,iVar7);
                std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                          (os,L"\", shape=doublecircle ];",0x18);
                plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
                if (plVar1 == (long *)0x0) goto LAB_0014391d;
                (**(code **)(*plVar1 + 0x50))(plVar1,10);
                std::wostream::put(wVar8);
                std::wostream::flush();
                iVar3 = (1 - iVar2) + iVar7;
                iVar7 = iVar7 + 1;
              } while (iVar3 != 1);
            }
            if ((this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar9 = 0;
              do {
                std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"S",1);
                pwVar4 = std::wostream::_M_insert<unsigned_long>((ulong)os);
                std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,L" [ label=\"",10);
                (*(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>)._vptr_NFABase[2])
                          (this,os,uVar9);
                std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                          (os,L"\", shape=circle ];",0x12);
                plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
                if (plVar1 == (long *)0x0) goto LAB_0014391d;
                (**(code **)(*plVar1 + 0x50))(plVar1,10);
                std::wostream::put(wVar8);
                std::wostream::flush();
                uVar9 = (ulong)((int)uVar9 + 1);
                uVar5 = ((long)(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                               super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                               super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333
                ;
              } while (uVar9 <= uVar5 && uVar5 - uVar9 != 0);
            }
            pLVar6 = (this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                     super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != pLVar6) {
              uVar9 = 0;
              do {
                (*pLVar6[uVar9].
                  super_NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                  ._vptr_NFABaseState[2])(pLVar6 + uVar9,os,uVar9);
                uVar9 = (ulong)((int)uVar9 + 1);
                pLVar6 = (this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                         super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar5 = ((long)(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                               super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar6 >> 4) *
                        -0x3333333333333333;
              } while (uVar9 <= uVar5 && uVar5 - uVar9 != 0);
            }
            std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"}",1);
            plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
            if (plVar1 != (long *)0x0) {
              (**(code **)(*plVar1 + 0x50))(plVar1,10);
              std::wostream::put(wVar8);
              std::wostream::flush();
              return;
            }
          }
        }
      }
    }
  }
LAB_0014391d:
  std::__throw_bad_cast();
}

Assistant:

virtual void print(std::wostream& os, const std::wstring& graph_name) const override
	{
		os << L"digraph " << graph_name << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\", style=\"filled\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

        int num_colors = get_color_num();

        for (int i = 1; i <= num_colors; i++)
        {
            os << L"A" << i << L" [ label=\"";
            os << i;
            os << L"\", shape=doublecircle ];" << std::endl;
        }

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			os << L"S" << i << L" [ label=\"";
			print_state(os, i);
			os << L"\", shape=circle ];" << std::endl;
		}

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			m_states[i].print(os, i);
		}

		os << L"}" << std::endl;
	}